

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
cbor_event_reader<jsoncons::stream_source<unsigned_char>>
          (cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          stream_source<unsigned_char> *source,cbor_decode_options *options,allocator<char> *alloc)

{
  char cVar1;
  
  *(undefined8 *)this = 0xb5c528;
  *(undefined8 *)(this + 0x2e8) = 0xb5c5c8;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>>
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             (this + 8),source,options,alloc);
  *(undefined ***)(this + 0x280) = &PTR__basic_item_event_visitor_00b5c400;
  *(undefined2 *)(this + 0x288) = 3;
  *(undefined4 *)(this + 0x2b0) = 0;
  *(undefined8 *)(this + 0x290) = 0;
  *(undefined8 *)(this + 0x298) = 0;
  *(undefined8 *)(this + 0x29c) = 0;
  *(undefined8 *)(this + 0x2a4) = 0;
  *(undefined8 *)(this + 0x2b8) = 0;
  *(undefined8 *)(this + 0x2c0) = 0;
  *(undefined8 *)(this + 0x2c8) = 0;
  *(undefined8 *)(this + 0x2d0) = 0;
  *(undefined8 *)(this + 0x2d1) = 0;
  *(undefined8 *)(this + 0x2d9) = 0;
  this[0x12] = (cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

cbor_event_reader(Sourceable&& source,
            const cbor_decode_options& options = cbor_decode_options(),
            const Allocator& alloc = Allocator())
            : parser_(std::forward<Sourceable>(source), options, alloc)
        {
            parser_.cursor_mode(true);
            if (!done())
            {
                next();
            }
        }